

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O3

void __thiscall
google::protobuf::Reflection::SwapOneofField<true>
          (Reflection *this,Message *lhs,Message *rhs,OneofDescriptor *oneof_descriptor)

{
  int key;
  int iVar1;
  LogMessage *pLVar2;
  FieldDescriptor *pFVar3;
  double *pdVar4;
  uint *puVar5;
  float *pfVar6;
  bool *pbVar7;
  ArenaStringPtr *pAVar8;
  FieldDescriptor *pFVar9;
  Message *sub_message;
  int *piVar10;
  ulong uVar11;
  LocalVarWrapper temp;
  MessageWrapper local_f0;
  MessageWrapper local_d8;
  FieldDescriptor *local_c0;
  int local_b4;
  LogMessage local_b0;
  TaggedPtr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_78;
  undefined1 *local_70;
  undefined8 local_68;
  undefined1 local_60 [16];
  Message *local_50;
  Message *local_48;
  FieldDescriptor *local_40;
  LogMessage *local_38;
  
  iVar1 = *(int *)(oneof_descriptor + 4);
  local_50 = rhs;
  local_48 = lhs;
  if ((iVar1 == 1) && ((*(byte *)(*(long *)(oneof_descriptor + 0x20) + 1) & 2) != 0)) {
    internal::LogMessage::LogMessage
              (&local_b0,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/generated_message_reflection.cc"
               ,0x36f);
    pLVar2 = internal::LogMessage::operator<<
                       (&local_b0,"CHECK failed: !oneof_descriptor->is_synthetic(): ");
    internal::LogFinisher::operator=((LogFinisher *)&local_78,pLVar2);
    internal::LogMessage::~LogMessage(&local_b0);
    iVar1 = *(int *)(oneof_descriptor + 4);
  }
  if ((iVar1 == 1) && ((*(byte *)(*(long *)(oneof_descriptor + 0x20) + 1) & 2) != 0)) {
    internal::LogMessage::LogMessage
              (&local_b0,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/message.h"
               ,0x5b7);
    pLVar2 = internal::LogMessage::operator<<
                       (&local_b0,"CHECK failed: !oneof_descriptor->is_synthetic(): ");
    internal::LogFinisher::operator=((LogFinisher *)&local_78,pLVar2);
    internal::LogMessage::~LogMessage(&local_b0);
    iVar1 = *(int *)(oneof_descriptor + 4);
  }
  uVar11 = (ulong)(uint)((int)((ulong)((long)oneof_descriptor -
                                      *(long *)(*(long *)(oneof_descriptor + 0x10) + 0x30)) >> 3) *
                         0x33333334 + (this->schema_).oneof_case_offset_);
  key = *(int *)((long)&(local_48->super_MessageLite)._vptr_MessageLite + uVar11);
  if ((iVar1 == 1) && ((*(byte *)(*(long *)(oneof_descriptor + 0x20) + 1) & 2) != 0)) {
    internal::LogMessage::LogMessage
              (&local_b0,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/message.h"
               ,0x5b7);
    pLVar2 = internal::LogMessage::operator<<
                       (&local_b0,"CHECK failed: !oneof_descriptor->is_synthetic(): ");
    internal::LogFinisher::operator=((LogFinisher *)&local_78,pLVar2);
    internal::LogMessage::~LogMessage(&local_b0);
    uVar11 = (ulong)(uint)((int)((ulong)((long)oneof_descriptor -
                                        *(long *)(*(long *)(oneof_descriptor + 0x10) + 0x30)) >> 3)
                           * 0x33333334 + (this->schema_).oneof_case_offset_);
  }
  local_b4 = *(int *)((long)&(local_50->super_MessageLite)._vptr_MessageLite + uVar11);
  local_70 = local_60;
  local_68 = 0;
  local_60[0] = 0;
  if (key == 0) {
    pFVar3 = (FieldDescriptor *)0x0;
    goto LAB_00399b6e;
  }
  pFVar3 = Descriptor::FindFieldByNumber(this->descriptor_,key);
  local_d8.message = local_48;
  local_d8.reflection = this;
  local_d8.field = pFVar3;
  if (*(once_flag **)(pFVar3 + 0x18) != (once_flag *)0x0) {
    local_b0._0_8_ = FieldDescriptor::TypeOnceInit;
    local_c0 = pFVar3;
    std::
    call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
              (*(once_flag **)(pFVar3 + 0x18),(_func_void_FieldDescriptor_ptr **)&local_b0,&local_c0
              );
  }
  switch(*(undefined4 *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)(byte)pFVar3[2] * 4)) {
  case 1:
    puVar5 = (uint *)GetRaw<int>(local_d8.reflection,local_d8.message,local_d8.field);
    goto LAB_00399a55;
  case 2:
    pAVar8 = (ArenaStringPtr *)GetRaw<long>(local_d8.reflection,local_d8.message,local_d8.field);
    goto LAB_00399b59;
  case 3:
    puVar5 = GetRaw<unsigned_int>(local_d8.reflection,local_d8.message,local_d8.field);
    goto LAB_00399a55;
  case 4:
    pAVar8 = (ArenaStringPtr *)
             GetRaw<unsigned_long>(local_d8.reflection,local_d8.message,local_d8.field);
    goto LAB_00399b59;
  case 5:
    pdVar4 = GetRaw<double>(local_d8.reflection,local_d8.message,local_d8.field);
    local_78.ptr_ = (void *)*pdVar4;
    break;
  case 6:
    pfVar6 = GetRaw<float>(local_d8.reflection,local_d8.message,local_d8.field);
    local_78.ptr_._0_4_ = *pfVar6;
    break;
  case 7:
    pbVar7 = GetRaw<bool>(local_d8.reflection,local_d8.message,local_d8.field);
    local_78.ptr_._0_1_ = (LogFinisher)*pbVar7;
    break;
  case 8:
    puVar5 = (uint *)GetRaw<int>(local_d8.reflection,local_d8.message,local_d8.field);
LAB_00399a55:
    local_78.ptr_._0_4_ = (float)*puVar5;
    break;
  case 9:
    pAVar8 = GetRaw<google::protobuf::internal::ArenaStringPtr>
                       (local_d8.reflection,local_d8.message,local_d8.field);
LAB_00399b59:
    local_78.ptr_ = (pAVar8->tagged_ptr_).ptr_;
    break;
  case 10:
    local_78.ptr_ =
         UnsafeArenaReleaseMessage
                   (local_d8.reflection,local_d8.message,local_d8.field,(MessageFactory *)0x0);
    break;
  default:
    internal::LogMessage::LogMessage
              (&local_b0,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/generated_message_reflection.cc"
               ,0x1bf);
    pLVar2 = internal::LogMessage::operator<<(&local_b0,"unimplemented type: ");
    if (*(once_flag **)(pFVar3 + 0x18) != (once_flag *)0x0) {
      local_c0 = (FieldDescriptor *)FieldDescriptor::TypeOnceInit;
      local_40 = pFVar3;
      std::
      call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                (*(once_flag **)(pFVar3 + 0x18),(_func_void_FieldDescriptor_ptr **)&local_c0,
                 &local_40);
    }
    pLVar2 = internal::LogMessage::operator<<
                       (pLVar2,*(int *)(FieldDescriptor::kTypeToCppTypeMap +
                                       (ulong)(byte)pFVar3[2] * 4));
    internal::LogFinisher::operator=((LogFinisher *)&local_c0,pLVar2);
    internal::LogMessage::~LogMessage(&local_b0);
  }
  SwapOneofField<true>::MessageWrapper::ClearOneofCase(&local_d8);
LAB_00399b6e:
  if (local_b4 != 0) {
    pFVar9 = Descriptor::FindFieldByNumber(this->descriptor_,local_b4);
    local_d8.message = local_48;
    local_f0.message = local_50;
    local_f0.reflection = this;
    local_f0.field = pFVar9;
    local_d8.reflection = this;
    local_d8.field = pFVar9;
    if (*(once_flag **)(pFVar9 + 0x18) != (once_flag *)0x0) {
      local_b0._0_8_ = FieldDescriptor::TypeOnceInit;
      local_c0 = pFVar9;
      std::
      call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                (*(once_flag **)(pFVar9 + 0x18),(_func_void_FieldDescriptor_ptr **)&local_b0,
                 &local_c0);
    }
    switch(*(undefined4 *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)(byte)pFVar9[2] * 4)) {
    case 1:
      piVar10 = GetRaw<int>(local_f0.reflection,local_f0.message,local_f0.field);
      local_b0.level_ = *piVar10;
      SetField<int>(local_d8.reflection,local_d8.message,local_d8.field,(int *)&local_b0);
      break;
    case 2:
      pdVar4 = (double *)GetRaw<long>(local_f0.reflection,local_f0.message,local_f0.field);
      local_b0._0_8_ = *pdVar4;
      SetField<long>(local_d8.reflection,local_d8.message,local_d8.field,(long *)&local_b0);
      break;
    case 3:
      puVar5 = GetRaw<unsigned_int>(local_f0.reflection,local_f0.message,local_f0.field);
      local_b0.level_ = *puVar5;
      SetField<unsigned_int>(local_d8.reflection,local_d8.message,local_d8.field,&local_b0.level_);
      break;
    case 4:
      pdVar4 = (double *)GetRaw<unsigned_long>(local_f0.reflection,local_f0.message,local_f0.field);
      local_b0._0_8_ = *pdVar4;
      SetField<unsigned_long>
                (local_d8.reflection,local_d8.message,local_d8.field,(unsigned_long *)&local_b0);
      break;
    case 5:
      pdVar4 = GetRaw<double>(local_f0.reflection,local_f0.message,local_f0.field);
      local_b0._0_8_ = *pdVar4;
      SetField<double>(local_d8.reflection,local_d8.message,local_d8.field,(double *)&local_b0);
      break;
    case 6:
      pfVar6 = GetRaw<float>(local_f0.reflection,local_f0.message,local_f0.field);
      local_b0.level_ = (LogLevel)*pfVar6;
      SetField<float>(local_d8.reflection,local_d8.message,local_d8.field,(float *)&local_b0);
      break;
    case 7:
      pbVar7 = GetRaw<bool>(local_f0.reflection,local_f0.message,local_f0.field);
      local_b0.level_._0_1_ = *pbVar7;
      SetField<bool>(local_d8.reflection,local_d8.message,local_d8.field,(bool *)&local_b0);
      break;
    case 8:
      piVar10 = GetRaw<int>(local_f0.reflection,local_f0.message,local_f0.field);
      local_b0.level_ = *piVar10;
      SetField<int>(local_d8.reflection,local_d8.message,local_d8.field,(int *)&local_b0);
      break;
    case 9:
      pAVar8 = GetRaw<google::protobuf::internal::ArenaStringPtr>
                         (local_f0.reflection,local_f0.message,local_f0.field);
      local_b0._0_8_ = (pAVar8->tagged_ptr_).ptr_;
      SetField<google::protobuf::internal::ArenaStringPtr>
                (local_d8.reflection,local_d8.message,local_d8.field,(ArenaStringPtr *)&local_b0);
      break;
    case 10:
      sub_message = UnsafeArenaReleaseMessage
                              (local_f0.reflection,local_f0.message,local_f0.field,
                               (MessageFactory *)0x0);
      UnsafeArenaSetAllocatedMessage
                (local_d8.reflection,local_d8.message,sub_message,local_d8.field);
      break;
    default:
      internal::LogMessage::LogMessage
                (&local_b0,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/generated_message_reflection.cc"
                 ,0x1bf);
      pLVar2 = internal::LogMessage::operator<<(&local_b0,"unimplemented type: ");
      if (*(once_flag **)(pFVar9 + 0x18) != (once_flag *)0x0) {
        local_c0 = (FieldDescriptor *)FieldDescriptor::TypeOnceInit;
        local_40 = pFVar9;
        local_38 = pLVar2;
        std::
        call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                  (*(once_flag **)(pFVar9 + 0x18),(_func_void_FieldDescriptor_ptr **)&local_c0,
                   &local_40);
        pLVar2 = local_38;
      }
      pLVar2 = internal::LogMessage::operator<<
                         (pLVar2,*(int *)(FieldDescriptor::kTypeToCppTypeMap +
                                         (ulong)(byte)pFVar9[2] * 4));
      internal::LogFinisher::operator=((LogFinisher *)&local_c0,pLVar2);
      internal::LogMessage::~LogMessage(&local_b0);
    }
    SwapOneofField<true>::MessageWrapper::ClearOneofCase(&local_f0);
  }
  if (key != 0) {
    local_f0.message = local_50;
    local_f0.reflection = this;
    local_f0.field = pFVar3;
    if (*(once_flag **)(pFVar3 + 0x18) != (once_flag *)0x0) {
      local_b0._0_8_ = FieldDescriptor::TypeOnceInit;
      local_c0 = pFVar3;
      std::
      call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                (*(once_flag **)(pFVar3 + 0x18),(_func_void_FieldDescriptor_ptr **)&local_b0,
                 &local_c0);
    }
    switch(*(undefined4 *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)(byte)pFVar3[2] * 4)) {
    case 1:
      local_b0.level_ = (LogLevel)local_78.ptr_._0_4_;
      SetField<int>(local_f0.reflection,local_f0.message,local_f0.field,(int *)&local_b0);
      break;
    case 2:
      local_b0._0_8_ = local_78.ptr_;
      SetField<long>(local_f0.reflection,local_f0.message,local_f0.field,(long *)&local_b0);
      break;
    case 3:
      local_b0.level_ = (LogLevel)local_78.ptr_._0_4_;
      SetField<unsigned_int>(local_f0.reflection,local_f0.message,local_f0.field,&local_b0.level_);
      break;
    case 4:
      local_b0._0_8_ = local_78.ptr_;
      SetField<unsigned_long>
                (local_f0.reflection,local_f0.message,local_f0.field,(unsigned_long *)&local_b0);
      break;
    case 5:
      local_b0._0_8_ = local_78.ptr_;
      SetField<double>(local_f0.reflection,local_f0.message,local_f0.field,(double *)&local_b0);
      break;
    case 6:
      local_b0.level_ = (LogLevel)local_78.ptr_._0_4_;
      SetField<float>(local_f0.reflection,local_f0.message,local_f0.field,(float *)&local_b0);
      break;
    case 7:
      local_b0.level_._0_1_ = local_78.ptr_._0_1_;
      SetField<bool>(local_f0.reflection,local_f0.message,local_f0.field,(bool *)&local_b0);
      break;
    case 8:
      local_b0.level_ = (LogLevel)local_78.ptr_._0_4_;
      SetField<int>(local_f0.reflection,local_f0.message,local_f0.field,(int *)&local_b0);
      break;
    case 9:
      local_b0._0_8_ = local_78.ptr_;
      SetField<google::protobuf::internal::ArenaStringPtr>
                (local_f0.reflection,local_f0.message,local_f0.field,(ArenaStringPtr *)&local_b0);
      break;
    case 10:
      UnsafeArenaSetAllocatedMessage
                (local_f0.reflection,local_f0.message,(Message *)local_78.ptr_,local_f0.field);
      break;
    default:
      internal::LogMessage::LogMessage
                (&local_b0,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/generated_message_reflection.cc"
                 ,0x1bf);
      pLVar2 = internal::LogMessage::operator<<(&local_b0,"unimplemented type: ");
      if (*(once_flag **)(pFVar3 + 0x18) != (once_flag *)0x0) {
        local_c0 = (FieldDescriptor *)FieldDescriptor::TypeOnceInit;
        local_40 = pFVar3;
        std::
        call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                  (*(once_flag **)(pFVar3 + 0x18),(_func_void_FieldDescriptor_ptr **)&local_c0,
                   &local_40);
      }
      pLVar2 = internal::LogMessage::operator<<
                         (pLVar2,*(int *)(FieldDescriptor::kTypeToCppTypeMap +
                                         (ulong)(byte)pFVar3[2] * 4));
      internal::LogFinisher::operator=((LogFinisher *)&local_c0,pLVar2);
      internal::LogMessage::~LogMessage(&local_b0);
    }
  }
  if ((*(int *)(oneof_descriptor + 4) == 1) &&
     ((*(byte *)(*(long *)(oneof_descriptor + 0x20) + 1) & 2) != 0)) {
    internal::LogMessage::LogMessage
              (&local_b0,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/generated_message_reflection.cc"
               ,0x97b);
    pLVar2 = internal::LogMessage::operator<<
                       (&local_b0,"CHECK failed: !oneof_descriptor->is_synthetic(): ");
    internal::LogFinisher::operator=((LogFinisher *)&local_c0,pLVar2);
    internal::LogMessage::~LogMessage(&local_b0);
  }
  iVar1 = (int)((ulong)((long)oneof_descriptor -
                       *(long *)(*(long *)(oneof_descriptor + 0x10) + 0x30)) >> 3) * 0x33333334;
  *(int *)((long)&(local_48->super_MessageLite)._vptr_MessageLite +
          (ulong)(uint)((this->schema_).oneof_case_offset_ + iVar1)) = local_b4;
  if ((*(int *)(oneof_descriptor + 4) == 1) &&
     ((*(byte *)(*(long *)(oneof_descriptor + 0x20) + 1) & 2) != 0)) {
    internal::LogMessage::LogMessage
              (&local_b0,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/generated_message_reflection.cc"
               ,0x97b);
    pLVar2 = internal::LogMessage::operator<<
                       (&local_b0,"CHECK failed: !oneof_descriptor->is_synthetic(): ");
    internal::LogFinisher::operator=((LogFinisher *)&local_c0,pLVar2);
    internal::LogMessage::~LogMessage(&local_b0);
    iVar1 = (int)((ulong)((long)oneof_descriptor -
                         *(long *)(*(long *)(oneof_descriptor + 0x10) + 0x30)) >> 3) * 0x33333334;
  }
  *(int *)((long)&(local_50->super_MessageLite)._vptr_MessageLite +
          (ulong)(uint)(iVar1 + (this->schema_).oneof_case_offset_)) = key;
  if (local_70 != local_60) {
    operator_delete(local_70);
  }
  return;
}

Assistant:

void Reflection::SwapOneofField(Message* lhs, Message* rhs,
                                const OneofDescriptor* oneof_descriptor) const {
  // Wraps a local variable to temporarily store oneof value.
  struct LocalVarWrapper {
#define LOCAL_VAR_ACCESSOR(type, var, name)               \
  type Get##name() const { return oneof_val.type_##var; } \
  void Set##name(type v) { oneof_val.type_##var = v; }

    LOCAL_VAR_ACCESSOR(int32_t, int32, Int32);
    LOCAL_VAR_ACCESSOR(int64_t, int64, Int64);
    LOCAL_VAR_ACCESSOR(uint32_t, uint32, Uint32);
    LOCAL_VAR_ACCESSOR(uint64_t, uint64, Uint64);
    LOCAL_VAR_ACCESSOR(float, float, Float);
    LOCAL_VAR_ACCESSOR(double, double, Double);
    LOCAL_VAR_ACCESSOR(bool, bool, Bool);
    LOCAL_VAR_ACCESSOR(int, enum, Enum);
    LOCAL_VAR_ACCESSOR(Message*, message, Message);
    LOCAL_VAR_ACCESSOR(ArenaStringPtr, arena_string_ptr, ArenaStringPtr);
    const std::string& GetString() const { return string_val; }
    void SetString(const std::string& v) { string_val = v; }
    Message* UnsafeGetMessage() const { return GetMessage(); }
    void UnsafeSetMessage(Message* v) { SetMessage(v); }
    void ClearOneofCase() {}

    union {
      int32_t type_int32;
      int64_t type_int64;
      uint32_t type_uint32;
      uint64_t type_uint64;
      float type_float;
      double type_double;
      bool type_bool;
      int type_enum;
      Message* type_message;
      internal::ArenaStringPtr type_arena_string_ptr;
    } oneof_val;

    // std::string cannot be in union.
    std::string string_val;
  };

  // Wraps a message pointer to read and write a field.
  struct MessageWrapper {
#define MESSAGE_FIELD_ACCESSOR(type, var, name)         \
  type Get##name() const {                              \
    return reflection->GetField<type>(*message, field); \
  }                                                     \
  void Set##name(type v) { reflection->SetField<type>(message, field, v); }

    MESSAGE_FIELD_ACCESSOR(int32_t, int32, Int32);
    MESSAGE_FIELD_ACCESSOR(int64_t, int64, Int64);
    MESSAGE_FIELD_ACCESSOR(uint32_t, uint32, Uint32);
    MESSAGE_FIELD_ACCESSOR(uint64_t, uint64, Uint64);
    MESSAGE_FIELD_ACCESSOR(float, float, Float);
    MESSAGE_FIELD_ACCESSOR(double, double, Double);
    MESSAGE_FIELD_ACCESSOR(bool, bool, Bool);
    MESSAGE_FIELD_ACCESSOR(int, enum, Enum);
    MESSAGE_FIELD_ACCESSOR(ArenaStringPtr, arena_string_ptr, ArenaStringPtr);
    std::string GetString() const {
      return reflection->GetString(*message, field);
    }
    void SetString(const std::string& v) {
      reflection->SetString(message, field, v);
    }
    Message* GetMessage() const {
      return reflection->ReleaseMessage(message, field);
    }
    void SetMessage(Message* v) {
      reflection->SetAllocatedMessage(message, v, field);
    }
    Message* UnsafeGetMessage() const {
      return reflection->UnsafeArenaReleaseMessage(message, field);
    }
    void UnsafeSetMessage(Message* v) {
      reflection->UnsafeArenaSetAllocatedMessage(message, v, field);
    }
    void ClearOneofCase() {
      *reflection->MutableOneofCase(message, field->containing_oneof()) = 0;
    }

    const Reflection* reflection;
    Message* message;
    const FieldDescriptor* field;
  };

  GOOGLE_DCHECK(!oneof_descriptor->is_synthetic());
  uint32 oneof_case_lhs = GetOneofCase(*lhs, oneof_descriptor);
  uint32 oneof_case_rhs = GetOneofCase(*rhs, oneof_descriptor);

  LocalVarWrapper temp;
  MessageWrapper lhs_wrapper, rhs_wrapper;
  const FieldDescriptor* field_lhs = nullptr;
  OneofFieldMover<unsafe_shallow_swap> mover;
  // lhs --> temp
  if (oneof_case_lhs > 0) {
    field_lhs = descriptor_->FindFieldByNumber(oneof_case_lhs);
    lhs_wrapper = {this, lhs, field_lhs};
    mover(field_lhs, &lhs_wrapper, &temp);
  }
  // rhs --> lhs
  if (oneof_case_rhs > 0) {
    const FieldDescriptor* f = descriptor_->FindFieldByNumber(oneof_case_rhs);
    lhs_wrapper = {this, lhs, f};
    rhs_wrapper = {this, rhs, f};
    mover(f, &rhs_wrapper, &lhs_wrapper);
  } else if (!unsafe_shallow_swap) {
    ClearOneof(lhs, oneof_descriptor);
  }
  // temp --> rhs
  if (oneof_case_lhs > 0) {
    rhs_wrapper = {this, rhs, field_lhs};
    mover(field_lhs, &temp, &rhs_wrapper);
  } else if (!unsafe_shallow_swap) {
    ClearOneof(rhs, oneof_descriptor);
  }

  if (unsafe_shallow_swap) {
    *MutableOneofCase(lhs, oneof_descriptor) = oneof_case_rhs;
    *MutableOneofCase(rhs, oneof_descriptor) = oneof_case_lhs;
  }
}